

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm_image.hpp
# Opt level: O0

ssize_t __thiscall sisl::utility::ppm_image::write(ppm_image *this,int __fd,void *__buf,size_t __n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  byte bVar5;
  _Ios_Openmode _Var6;
  char *pcVar7;
  ostream *poVar8;
  void *pvVar9;
  Matrix<double,__1,_1,_0,__1,_1> *other;
  Scalar *pSVar10;
  undefined8 extraout_RAX;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *this_00;
  double extraout_XMM0_Qa;
  undefined1 local_2b0 [8];
  vector pix;
  uint local_298;
  int j;
  int i;
  ofstream fp;
  ppm_image local_90;
  Scalar local_68;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_60;
  int local_3c;
  undefined1 local_38 [8];
  vector min_max;
  bool normalize_local;
  string *out_local;
  ppm_image *this_local;
  
  min_max.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._7_1_ =
       (byte)__buf & 1;
  local_3c = 2;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_38,&local_3c);
  if ((min_max.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._7_1_
      & 1) == 0) {
    local_68 = 0.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
              (&local_60,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_38,&local_68);
    local_90.m_aArray.first = (pointer)0x3ff0000000000000;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              (&local_60,(Scalar *)&local_90.m_aArray.first);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_60);
  }
  else {
    calc_minmax(&local_90);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_38,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_90);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&local_90);
  }
  pcVar7 = (char *)std::__cxx11::string::c_str();
  _Var6 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream(&i,pcVar7,_Var6);
  bVar5 = std::ios::good();
  if ((bVar5 & 1) == 0) {
    this_local._7_1_ = 0;
  }
  else {
    poVar8 = std::operator<<((ostream *)&i,"P3");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = (ostream *)std::ostream::operator<<(&i,this->m_iWidth);
    poVar8 = std::operator<<(poVar8," ");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,this->m_iHeight);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<((ostream *)&i,"255");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    for (local_298 = 0; (int)local_298 < this->m_iHeight; local_298 = local_298 + 1) {
      for (pix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
                = 0;
          (int)pix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
               _4_4_ < this->m_iWidth;
          pix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
               = pix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 ._4_4_ + 1) {
        other = array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::operator()(&this->m_aArray,
                             pix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows._4_4_,(ulong)local_298);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_2b0,other);
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_38,1);
        this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_38;
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[](this_00,0);
        std::abs((int)this_00);
        if ((1e-06 <= extraout_XMM0_Qa) ||
           ((min_max.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
             ._7_1_ & 1) == 0)) {
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_2b0,0);
          dVar1 = *pSVar10;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_38,0);
          dVar2 = *pSVar10;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_38,1);
          dVar3 = *pSVar10;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_38,0);
          dVar4 = *pSVar10;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_2b0,0);
          *pSVar10 = ((dVar1 - dVar2) * 255.0) / (dVar3 - dVar4);
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_2b0,1);
          dVar1 = *pSVar10;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_38,0);
          dVar2 = *pSVar10;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_38,1);
          dVar3 = *pSVar10;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_38,0);
          dVar4 = *pSVar10;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_2b0,1);
          *pSVar10 = ((dVar1 - dVar2) * 255.0) / (dVar3 - dVar4);
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_2b0,2);
          dVar1 = *pSVar10;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_38,0);
          dVar2 = *pSVar10;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_38,1);
          dVar3 = *pSVar10;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_38,0);
          dVar4 = *pSVar10;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_2b0,2);
          *pSVar10 = ((dVar1 - dVar2) * 255.0) / (dVar3 - dVar4);
        }
        else {
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_2b0,2);
          *pSVar10 = 0.0;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_2b0,1);
          *pSVar10 = 0.0;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_2b0,0);
          *pSVar10 = 0.0;
        }
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_2b0
                             ,0);
        poVar8 = (ostream *)std::ostream::operator<<(&i,(int)*pSVar10);
        poVar8 = std::operator<<(poVar8," ");
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_2b0
                             ,1);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)*pSVar10);
        poVar8 = std::operator<<(poVar8," ");
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_2b0
                             ,2);
        pvVar9 = (void *)std::ostream::operator<<(poVar8,(int)*pSVar10);
        std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_2b0);
      }
    }
    std::ofstream::close();
    this_local._7_1_ = 1;
  }
  std::ofstream::~ofstream(&i);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_38);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_);
}

Assistant:

bool write(const std::string &out, bool normalize = true) {
                using namespace std;
                vector min_max(2);

                if(!normalize) {
                    min_max << 0, 1.;
                }else {
                    min_max = calc_minmax();
    
                }

                // open file and check if it's valid
                ofstream fp(out.c_str(), ios::out | ios::binary);
                if(!fp.good()) return false;

                // write the header
                fp << "P3" << endl;
                fp << m_iWidth << " " << m_iHeight << endl;
                fp << "255" << endl;

                // Write image data
                for(int i = 0; i < m_iHeight; i++) {
                    for(int j = 0; j < m_iWidth; j++) {
                        vector pix = m_aArray(j,i);

                        // If min/max are equal, and we're normalizing, this is just blank
                        if(abs(min_max[1] - min_max[0]) < 1e-6 && normalize) {
                            pix[0] = pix[1] = pix[2] = 0.;
                        } else {
                            pix[0] = 255. * (pix[0] - min_max[0])/(min_max[1] - min_max[0]);
                            pix[1] = 255. * (pix[1] - min_max[0])/(min_max[1] - min_max[0]);
                            pix[2] = 255. * (pix[2] - min_max[0])/(min_max[1] - min_max[0]);
                        }
                        fp << (int)pix[0] << " " << (int)pix[1] << " " << (int)pix[2] << endl;
                    }
                }
                fp.close();
                return true;
            }